

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

void __thiscall
crnlib::mipmapped_texture::print_crn_comp_params(mipmapped_texture *this,crn_comp_params *p)

{
  char *pcVar1;
  
  console::debug("CRN compression params:");
  pcVar1 = crn_get_file_type_ext(p->m_file_type);
  console::debug("      File Type: %s",pcVar1);
  console::debug("  Quality level: %u",(ulong)p->m_quality_level);
  console::debug(" Target Bitrate: %f",(double)p->m_target_bitrate);
  console::debug("          Faces: %u",(ulong)p->m_faces);
  console::debug("          Width: %u",(ulong)p->m_width);
  console::debug("         Height: %u",(ulong)p->m_height);
  console::debug("         Levels: %u",(ulong)p->m_levels);
  pcVar1 = crn_get_format_string(p->m_format);
  console::debug("   Pixel Format: %s",pcVar1);
  console::debug("Use manual CRN palette sizes: %u",(ulong)(p->m_flags >> 6 & 1));
  console::debug("Color endpoints: %u",(ulong)p->m_crn_color_endpoint_palette_size);
  console::debug("Color selectors: %u",(ulong)p->m_crn_color_selector_palette_size);
  console::debug("Alpha endpoints: %u",(ulong)p->m_crn_alpha_endpoint_palette_size);
  console::debug("Alpha selectors: %u",(ulong)p->m_crn_alpha_selector_palette_size);
  console::debug("Flags:");
  console::debug("    Perceptual: %u",(ulong)(p->m_flags & 1));
  console::debug("  Hierarchical: %u",(ulong)(p->m_flags >> 1 & 1));
  console::debug("  UseBothBlockTypes: %u",(ulong)(p->m_flags >> 3 & 1));
  console::debug("  UseTransparentIndicesForBlack: %u",(ulong)(p->m_flags >> 4 & 1));
  console::debug("  DisableEndpointCaching: %u",(ulong)(p->m_flags >> 5 & 1));
  console::debug("GrayscaleSampling: %u",(ulong)(p->m_flags >> 8 & 1));
  console::debug("  UseDXT1ATransparency: %u",(ulong)(p->m_flags >> 7 & 1));
  console::debug("AdaptiveTileColorPSNRDerating: %2.2fdB",
                 (double)p->m_crn_adaptive_tile_color_psnr_derating);
  console::debug("AdaptiveTileAlphaPSNRDerating: %2.2fdB",
                 (double)p->m_crn_adaptive_tile_alpha_psnr_derating);
  console::debug("NumHelperThreads: %u",(ulong)p->m_num_helper_threads);
  return;
}

Assistant:

void mipmapped_texture::print_crn_comp_params(const crn_comp_params& p) {
  console::debug("CRN compression params:");
  console::debug("      File Type: %s", crn_get_file_type_ext(p.m_file_type));
  console::debug("  Quality level: %u", p.m_quality_level);
  console::debug(" Target Bitrate: %f", p.m_target_bitrate);
  console::debug("          Faces: %u", p.m_faces);
  console::debug("          Width: %u", p.m_width);
  console::debug("         Height: %u", p.m_height);
  console::debug("         Levels: %u", p.m_levels);
  console::debug("   Pixel Format: %s", crn_get_format_string(p.m_format));
  console::debug("Use manual CRN palette sizes: %u", p.get_flag(cCRNCompFlagManualPaletteSizes));
  console::debug("Color endpoints: %u", p.m_crn_color_endpoint_palette_size);
  console::debug("Color selectors: %u", p.m_crn_color_selector_palette_size);
  console::debug("Alpha endpoints: %u", p.m_crn_alpha_endpoint_palette_size);
  console::debug("Alpha selectors: %u", p.m_crn_alpha_selector_palette_size);
  console::debug("Flags:");
  console::debug("    Perceptual: %u", p.get_flag(cCRNCompFlagPerceptual));
  console::debug("  Hierarchical: %u", p.get_flag(cCRNCompFlagHierarchical));
  console::debug("  UseBothBlockTypes: %u", p.get_flag(cCRNCompFlagUseBothBlockTypes));
  console::debug("  UseTransparentIndicesForBlack: %u", p.get_flag(cCRNCompFlagUseTransparentIndicesForBlack));
  console::debug("  DisableEndpointCaching: %u", p.get_flag(cCRNCompFlagDisableEndpointCaching));
  console::debug("GrayscaleSampling: %u", p.get_flag(cCRNCompFlagGrayscaleSampling));
  console::debug("  UseDXT1ATransparency: %u", p.get_flag(cCRNCompFlagDXT1AForTransparency));
  console::debug("AdaptiveTileColorPSNRDerating: %2.2fdB", p.m_crn_adaptive_tile_color_psnr_derating);
  console::debug("AdaptiveTileAlphaPSNRDerating: %2.2fdB", p.m_crn_adaptive_tile_alpha_psnr_derating);
  console::debug("NumHelperThreads: %u", p.m_num_helper_threads);
}